

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HighsSparseMatrix.cpp
# Opt level: O0

void __thiscall HighsSparseMatrix::unapplyScale(HighsSparseMatrix *this,HighsScale *scale)

{
  double dVar1;
  double dVar2;
  int iVar3;
  bool bVar4;
  reference pvVar5;
  const_reference pvVar6;
  reference pvVar7;
  long in_RSI;
  HighsSparseMatrix *in_RDI;
  HighsInt iCol_1;
  HighsInt iEl_1;
  HighsInt iRow_1;
  HighsInt iRow;
  HighsInt iEl;
  HighsInt iCol;
  int local_24;
  int local_20;
  int local_18;
  int local_14;
  
  bVar4 = isColwise(in_RDI);
  if (bVar4) {
    for (local_14 = 0; local_14 < in_RDI->num_col_; local_14 = local_14 + 1) {
      pvVar5 = std::vector<int,_std::allocator<int>_>::operator[](&in_RDI->start_,(long)local_14);
      for (local_18 = *pvVar5;
          pvVar5 = std::vector<int,_std::allocator<int>_>::operator[]
                             (&in_RDI->start_,(long)(local_14 + 1)), local_18 < *pvVar5;
          local_18 = local_18 + 1) {
        pvVar5 = std::vector<int,_std::allocator<int>_>::operator[](&in_RDI->index_,(long)local_18);
        iVar3 = *pvVar5;
        pvVar6 = std::vector<double,_std::allocator<double>_>::operator[]
                           ((vector<double,_std::allocator<double>_> *)(in_RSI + 0x18),
                            (long)local_14);
        dVar1 = *pvVar6;
        pvVar6 = std::vector<double,_std::allocator<double>_>::operator[]
                           ((vector<double,_std::allocator<double>_> *)(in_RSI + 0x30),(long)iVar3);
        dVar2 = *pvVar6;
        pvVar7 = std::vector<double,_std::allocator<double>_>::operator[]
                           (&in_RDI->value_,(long)local_18);
        *pvVar7 = *pvVar7 / (dVar1 * dVar2);
      }
    }
  }
  else {
    for (local_20 = 0; local_20 < in_RDI->num_row_; local_20 = local_20 + 1) {
      pvVar5 = std::vector<int,_std::allocator<int>_>::operator[](&in_RDI->start_,(long)local_20);
      for (local_24 = *pvVar5;
          pvVar5 = std::vector<int,_std::allocator<int>_>::operator[]
                             (&in_RDI->start_,(long)(local_20 + 1)), local_24 < *pvVar5;
          local_24 = local_24 + 1) {
        pvVar5 = std::vector<int,_std::allocator<int>_>::operator[](&in_RDI->index_,(long)local_24);
        pvVar6 = std::vector<double,_std::allocator<double>_>::operator[]
                           ((vector<double,_std::allocator<double>_> *)(in_RSI + 0x18),(long)*pvVar5
                           );
        dVar1 = *pvVar6;
        pvVar6 = std::vector<double,_std::allocator<double>_>::operator[]
                           ((vector<double,_std::allocator<double>_> *)(in_RSI + 0x30),
                            (long)local_20);
        dVar2 = *pvVar6;
        pvVar7 = std::vector<double,_std::allocator<double>_>::operator[]
                           (&in_RDI->value_,(long)local_24);
        *pvVar7 = *pvVar7 / (dVar1 * dVar2);
      }
    }
  }
  return;
}

Assistant:

void HighsSparseMatrix::unapplyScale(const HighsScale& scale) {
  assert(this->formatOk());
  if (this->isColwise()) {
    for (HighsInt iCol = 0; iCol < this->num_col_; iCol++) {
      for (HighsInt iEl = this->start_[iCol]; iEl < this->start_[iCol + 1];
           iEl++) {
        HighsInt iRow = this->index_[iEl];
        this->value_[iEl] /= (scale.col[iCol] * scale.row[iRow]);
      }
    }
  } else {
    for (HighsInt iRow = 0; iRow < this->num_row_; iRow++) {
      for (HighsInt iEl = this->start_[iRow]; iEl < this->start_[iRow + 1];
           iEl++) {
        HighsInt iCol = this->index_[iEl];
        this->value_[iEl] /= (scale.col[iCol] * scale.row[iRow]);
      }
    }
  }
}